

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

IOUAmount __thiscall jbcoin::STAmount::iou(STAmount *this)

{
  IOUAmount IVar1;
  mantissa_type mStack_28;
  exponent_type exponent;
  int64_t mantissa;
  STAmount *this_local;
  undefined4 local_10;
  
  if ((this->mIsNative & 1U) != 0) {
    Throw<std::logic_error,char_const(&)[43]>
              ((char (*) [43])"Cannot return native STAmount as IOUAmount");
  }
  mStack_28 = this->mValue;
  if ((this->mIsNegative & 1U) != 0) {
    mStack_28 = -mStack_28;
  }
  IOUAmount::IOUAmount((IOUAmount *)&this_local,mStack_28,this->mOffset);
  IVar1._12_4_ = 0;
  IVar1.mantissa_ = (int64_t)this_local;
  IVar1.exponent_ = local_10;
  return IVar1;
}

Assistant:

IOUAmount STAmount::iou () const
{
    if (mIsNative)
        Throw<std::logic_error> ("Cannot return native STAmount as IOUAmount");

    auto mantissa = static_cast<std::int64_t> (mValue);
    auto exponent = mOffset;

    if (mIsNegative)
        mantissa = -mantissa;

    return { mantissa, exponent };
}